

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

bool __thiscall cmGeneratedFileStream::Close(cmGeneratedFileStream *this)

{
  bool bVar1;
  
  (this->super_ofstream).field_0x139 =
       ((&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
        [(long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0;
  std::ofstream::close();
  bVar1 = cmGeneratedFileStreamBase::Close
                    ((cmGeneratedFileStreamBase *)
                     &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                      field_0xf8);
  return bVar1;
}

Assistant:

bool cmGeneratedFileStream::Close()
{
  // Save whether the temporary output file is valid before closing.
  this->Okay = !this->fail();

  // Close the temporary output file.
  this->Stream::close();

  // Remove the temporary file (possibly by renaming to the real file).
  return this->cmGeneratedFileStreamBase::Close();
}